

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcsample.c
# Opt level: O3

void fullsize_downsample(j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                        JSAMPARRAY output_data)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  
  jcopy_sample_rows(input_data,0,output_data,0,cinfo->max_v_samp_factor,cinfo->image_width);
  iVar1 = cinfo->max_v_samp_factor;
  uVar2 = cinfo->image_width;
  iVar3 = compptr->DCT_h_scaled_size * compptr->width_in_blocks;
  if (0 < (int)(iVar3 - uVar2) && 0 < (long)iVar1) {
    lVar4 = 0;
    do {
      memset(output_data[lVar4] + uVar2,(uint)output_data[lVar4][(ulong)uVar2 - 1],
             (ulong)(iVar3 + ~uVar2) + 1);
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  return;
}

Assistant:

METHODDEF(void)
fullsize_downsample (j_compress_ptr cinfo, jpeg_component_info * compptr,
		     JSAMPARRAY input_data, JSAMPARRAY output_data)
{
  /* Copy the data */
  jcopy_sample_rows(input_data, 0, output_data, 0,
		    cinfo->max_v_samp_factor, cinfo->image_width);
  /* Edge-expand */
  expand_right_edge(output_data, cinfo->max_v_samp_factor, cinfo->image_width,
		    compptr->width_in_blocks * compptr->DCT_h_scaled_size);
}